

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

void hputl(char *hstring,char *keyword,int lval)

{
  char local_24 [8];
  char value [8];
  int lval_local;
  char *keyword_local;
  char *hstring_local;
  
  value._0_4_ = lval;
  unique0x1000009b = keyword;
  if (lval == 0) {
    strcpy(local_24,"F");
  }
  else {
    strcpy(local_24,"T");
  }
  hputc(hstring,stack0xffffffffffffffe8,local_24);
  return;
}

Assistant:

static void
hputl (hstring, keyword,lval)

char *hstring;		/* FITS header */
char *keyword;		/* Keyword name */
int lval;		/* logical variable (0=false, else true) */
{
    char value[8];

    /* Translate value from binary to ASCII */
    if (lval)
	strcpy (value, "T");
    else
	strcpy (value, "F");

    /* Put value into header string */
    hputc (hstring,keyword,value);

    /* Return to calling program */
    return;
}